

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::contactTest
          (cbtCollisionWorld *this,cbtCollisionObject *colObj,ContactResultCallback *resultCallback)

{
  cbtVector3 aabbMax;
  cbtVector3 aabbMin;
  cbtSingleContactCallback contactCB;
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined **local_48;
  cbtCollisionObject *local_40;
  cbtCollisionWorld *local_38;
  ContactResultCallback *local_30;
  
  (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
            (colObj->m_collisionShape,&colObj->m_worldTransform,local_58,auStack_68);
  local_48 = &PTR__cbtBroadphaseAabbCallback_00b700e0;
  local_40 = colObj;
  local_38 = this;
  local_30 = resultCallback;
  (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[7])
            (this->m_broadphasePairCache,local_58,auStack_68);
  return;
}

Assistant:

void cbtCollisionWorld::contactTest(cbtCollisionObject* colObj, ContactResultCallback& resultCallback)
{
	cbtVector3 aabbMin, aabbMax;
	colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), aabbMin, aabbMax);
	cbtSingleContactCallback contactCB(colObj, this, resultCallback);

	m_broadphasePairCache->aabbTest(aabbMin, aabbMax, contactCB);
}